

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall
cmComputeLinkDepends::HandleSharedDependency(cmComputeLinkDepends *this,SharedDepEntry *dep)

{
  pointer *ppcVar1;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  _Rb_tree_color _Var2;
  pointer pLVar3;
  iterator __position;
  cmGeneratorTarget *this_01;
  cmGraphEdge cVar4;
  iterator iVar5;
  cmLinkInterface *iface;
  cmGraphEdge local_30;
  
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LinkEntryIndex)._M_t,(key_type *)dep);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar5._M_node = (_Base_ptr)AllocateLinkEntry(this,(string *)dep);
    _Var2 = iVar5._M_node[2]._M_color;
    pLVar3 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_assign((string *)(pLVar3 + (int)_Var2));
    pLVar3[(int)_Var2].Target = (dep->Item).Target;
    pLVar3[(int)_Var2].IsSharedDep = true;
  }
  _Var2 = iVar5._M_node[2]._M_color;
  pLVar3 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &(this->EntryConstraintGraph).
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start[dep->DependerIndex].
             super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  local_30.Strong = true;
  __position._M_current =
       (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_30.Dest = _Var2;
  if (__position._M_current ==
      (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
              (this_00,__position,&local_30);
  }
  else {
    cVar4.Strong = true;
    cVar4._5_3_ = local_30._5_3_;
    cVar4.Dest = _Var2;
    *__position._M_current = cVar4;
    ppcVar1 = &(this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  this_01 = pLVar3[(int)_Var2].Target;
  if (this_01 != (cmGeneratorTarget *)0x0) {
    iface = cmGeneratorTarget::GetLinkInterface(this_01,&this->Config,this->Target);
    if (iface != (cmLinkInterface *)0x0) {
      FollowSharedDeps(this,_Var2,iface,true);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::HandleSharedDependency(SharedDepEntry const& dep)
{
  // Check if the target already has an entry.
  std::map<std::string, int>::iterator lei =
    this->LinkEntryIndex.find(dep.Item);
  if (lei == this->LinkEntryIndex.end()) {
    // Allocate a spot for the item entry.
    lei = this->AllocateLinkEntry(dep.Item);

    // Initialize the item entry.
    LinkEntry& entry = this->EntryList[lei->second];
    entry.Item = dep.Item;
    entry.Target = dep.Item.Target;

    // This item was added specifically because it is a dependent
    // shared library.  It may get special treatment
    // in cmComputeLinkInformation.
    entry.IsSharedDep = true;
  }

  // Get the link entry for this target.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];

  // This shared library dependency must follow the item that listed
  // it.
  this->EntryConstraintGraph[dep.DependerIndex].push_back(index);

  // Target items may have their own dependencies.
  if (entry.Target) {
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      // Follow public and private dependencies transitively.
      this->FollowSharedDeps(index, iface, true);
    }
  }
}